

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

Ptr __thiscall
TgBot::Api::sendVideoNote
          (Api *this,int64_t chatId,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *videoNote,int64_t replyToMessageId,bool disableNotification,int32_t duration,
          int32_t length,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *thumb,Ptr *replyMarkup)

{
  Ptr *this_00;
  bool bVar1;
  int iVar2;
  type psVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  type pbVar7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  Ptr PVar9;
  __shared_ptr *in_stack_00000020;
  allocator local_119;
  string local_118;
  ptree local_f8;
  string local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> thumbStr;
  undefined1 local_88 [8];
  shared_ptr<TgBot::InputFile> file_1;
  undefined1 local_70 [8];
  shared_ptr<TgBot::InputFile> file;
  undefined1 local_50 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  long lStack_30;
  bool disableNotification_local;
  int64_t replyToMessageId_local;
  variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *videoNote_local;
  int64_t chatId_local;
  Api *this_local;
  
  this_00 = replyMarkup;
  lStack_30 = CONCAT71(in_register_00000081,disableNotification);
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)duration & 1;
  replyToMessageId_local = replyToMessageId;
  videoNote_local = videoNote;
  chatId_local = chatId;
  this_local = this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_50);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_50,8);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
             (char (*) [8])0x4758d6,(long *)&videoNote_local);
  iVar2 = boost::
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::which((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)replyToMessageId);
  if (iVar2 == 0) {
    psVar3 = boost::
             get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       ((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)replyToMessageId);
    std::shared_ptr<TgBot::InputFile>::shared_ptr((shared_ptr<TgBot::InputFile> *)local_70,psVar3);
    peVar4 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    file_1.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
         = 1;
    peVar5 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    peVar6 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [11])"video_note",&peVar4->data,
               (bool *)((long)&file_1.
                               super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7),&peVar5->mimeType,&peVar6->fileName);
    std::shared_ptr<TgBot::InputFile>::~shared_ptr((shared_ptr<TgBot::InputFile> *)local_70);
  }
  else {
    pbVar7 = boost::get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       ((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)replyToMessageId);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [11])"video_note",pbVar7);
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [21])"disable_notification",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  if (length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[9],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [9])0x475c4a,&length);
  }
  if ((int)thumb != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [7])"length",(int *)&thumb);
  }
  iVar2 = boost::
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::which((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
  if (iVar2 == 0) {
    psVar3 = boost::
             get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       ((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
    std::shared_ptr<TgBot::InputFile>::shared_ptr((shared_ptr<TgBot::InputFile> *)local_88,psVar3);
    peVar4 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    thumbStr.field_2._M_local_buf[0xf] = '\x01';
    peVar5 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    peVar6 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [6])"thumb",&peVar4->data,(bool *)(thumbStr.field_2._M_local_buf + 0xf),
               &peVar5->mimeType,&peVar6->fileName);
    std::shared_ptr<TgBot::InputFile>::~shared_ptr((shared_ptr<TgBot::InputFile> *)local_88);
  }
  else {
    pbVar7 = boost::get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       ((variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
    std::__cxx11::string::string((string *)local_b0,(string *)pbVar7);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
      emplace_back<char_const(&)[6],std::__cxx11::string&>
                ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
                 (char (*) [6])"thumb",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_stack_00000020);
  if (bVar1) {
    TgTypeParser::parseGenericReply_abi_cxx11_
              (&local_d0,(TgTypeParser *)(chatId + 0x28),(Ptr *)in_stack_00000020);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [13])"reply_markup",&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (lStack_30 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_50,
               (char (*) [20])"reply_to_message_id",&stack0xffffffffffffffd0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"sendVideoNote",&local_119);
  sendRequest(&local_f8,(Api *)chatId,&local_118,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_50);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)(chatId + 0x28));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_50);
  PVar9.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar9.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar9.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendVideoNote(int64_t chatId, const boost::variant<InputFile::Ptr, std::string> videoNote, int64_t replyToMessageId, bool disableNotification, int32_t duration, int32_t length, const boost::variant<InputFile::Ptr, std::string> thumb, const GenericReply::Ptr replyMarkup) const {
    vector<HttpReqArg> args;
    args.reserve(8);
    args.emplace_back("chat_id", chatId);
    if (videoNote.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(videoNote);
        args.emplace_back("video_note", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        args.emplace_back("video_note", boost::get<std::string>(videoNote));
    }
    if (disableNotification) {
        args.emplace_back("disable_notification", disableNotification);
    }
    if (duration) {
        args.emplace_back("duration", duration);
    }
    if (length) {
        args.emplace_back("length", length);
    }
    if (thumb.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(thumb);
        args.emplace_back("thumb", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        auto thumbStr = boost::get<std::string>(thumb);
        if (!thumbStr.empty()) {
            args.emplace_back("thumb", thumbStr);
        }
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendVideoNote", args));
}